

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtmg(fitsfile *infptr,fitsfile *outfptr,int mgopt,int *status)

{
  int iVar1;
  int *in_RCX;
  int in_EDX;
  bool bVar2;
  fitsfile *tmpfptr;
  long nmembers;
  long i;
  int *in_stack_00000048;
  long *in_stack_00000050;
  fitsfile *in_stack_00000058;
  int *in_stack_000019e0;
  fitsfile **in_stack_000019e8;
  long in_stack_000019f0;
  fitsfile *in_stack_000019f8;
  int *in_stack_000027e0;
  int in_stack_000027ec;
  fitsfile *in_stack_000027f0;
  fitsfile *in_stack_000027f8;
  int *in_stack_00005d98;
  int in_stack_00005da4;
  fitsfile *in_stack_00005da8;
  int *status_00;
  fitsfile *fptr;
  long local_30;
  int local_4;
  
  fptr = (fitsfile *)0x0;
  status_00 = (int *)0x0;
  if (*in_RCX == 0) {
    iVar1 = ffgtnm(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    *in_RCX = iVar1;
    local_30 = 1;
    while( true ) {
      bVar2 = false;
      if (local_30 <= (long)fptr) {
        bVar2 = *in_RCX == 0;
      }
      if (!bVar2) break;
      iVar1 = ffgmop(in_stack_000019f8,in_stack_000019f0,in_stack_000019e8,in_stack_000019e0);
      *in_RCX = iVar1;
      iVar1 = ffgtam(in_stack_000027f8,in_stack_000027f0,in_stack_000027ec,in_stack_000027e0);
      *in_RCX = iVar1;
      if (*in_RCX == 0x155) {
        *in_RCX = 0;
      }
      if (status_00 != (int *)0x0) {
        ffclos(fptr,status_00);
        status_00 = (int *)0x0;
      }
      local_30 = local_30 + 1;
    }
    if ((*in_RCX == 0) && (in_EDX == 1)) {
      iVar1 = ffgtrm(in_stack_00005da8,in_stack_00005da4,in_stack_00005d98);
      *in_RCX = iVar1;
    }
    if (status_00 != (int *)0x0) {
      ffclos(fptr,status_00);
    }
    local_4 = *in_RCX;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffgtmg(fitsfile *infptr,  /* FITS file ptr to source grouping table      */
	   fitsfile *outfptr, /* FITS file ptr to target grouping table      */
	   int       mgopt,   /* code specifying merge options:
				 OPT_MRG_COPY (0) ==> copy members to target
				                      group, leaving source 
						      group in place
				 OPT_MRG_MOV  (1) ==> move members to target
				                      group, source group is
						      deleted after merge    */
	   int      *status)   /* return status code                         */
     

/*
  merge two grouping tables by combining their members into a single table. 
  The source grouping table must be the CHDU of the fitsfile pointed to by 
  infptr, and the target grouping table must be the CHDU of the fitsfile to by 
  outfptr. All members of the source grouping table shall be copied to the
  target grouping table. If the mgopt parameter is OPT_MRG_COPY then the source
  grouping table continues to exist after the merge. If the mgopt parameter
  is OPT_MRG_MOV then the source grouping table is deleted after the merge, 
  and all member HDUs are updated accordingly.
*/
{
  long i ;
  long nmembers = 0;

  fitsfile *tmpfptr = NULL;


  if(*status != 0) return(*status);

  do
    {

      *status = fits_get_num_members(infptr,&nmembers,status);

      for(i = 1; i <= nmembers && *status == 0; ++i)
	{
	  *status = fits_open_member(infptr,i,&tmpfptr,status);
	  *status = fits_add_group_member(outfptr,tmpfptr,0,status);

	  if(*status == HDU_ALREADY_MEMBER) *status = 0;

	  if(tmpfptr != NULL)
	    {
	      fits_close_file(tmpfptr,status);
	      tmpfptr = NULL;
	    }
	}

      if(*status != 0) continue;

      if(mgopt == OPT_MRG_MOV) 
	*status = fits_remove_group(infptr,OPT_RM_GPT,status);

    }while(0);

  if(tmpfptr != NULL)
    {
      fits_close_file(tmpfptr,status);
    }

  return(*status);
}